

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_t Catch::listTests(Config *config)

{
  pointer *this;
  unsigned_long uVar1;
  bool bVar2;
  int iVar3;
  vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_> *pvVar4;
  IRegistryHub *pIVar5;
  undefined4 extraout_var;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *this_00;
  reference pTVar6;
  pointer pTVar7;
  TestCaseInfo *pTVar8;
  TextAttributes *pTVar9;
  unsigned_long *puVar10;
  size_t sVar11;
  string *psVar12;
  ulong uVar13;
  long lVar14;
  ostream *poVar15;
  allocator local_289;
  string local_288 [32];
  pluralise local_268;
  allocator local_239;
  string local_238 [32];
  pluralise local_218;
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [38];
  Colour local_19a;
  Colour local_199;
  string local_198 [6];
  Colour colourGuard_1;
  Colour colourGuard;
  string nameCol;
  Code local_174;
  size_t sStack_170;
  Code colour;
  size_t local_168;
  ulong local_160;
  size_t i;
  TextAttributes local_148;
  undefined1 local_128 [8];
  Text tagsWrapper;
  undefined1 local_b0 [8];
  Text nameWrapper;
  size_t local_50;
  size_t matchedTests;
  unsigned_long local_40;
  unsigned_long local_38;
  size_t maxNameLen;
  size_t maxTagLen;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTests;
  Config *config_local;
  
  pvVar4 = Config::filters(config);
  bVar2 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    (pvVar4);
  if (bVar2) {
    std::operator<<((ostream *)&std::cout,"All available test cases:\n");
  }
  else {
    std::operator<<((ostream *)&std::cout,"Matching test cases:\n");
  }
  pIVar5 = getRegistryHub();
  iVar3 = (*pIVar5->_vptr_IRegistryHub[3])();
  this_00 = (vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x10))();
  itEnd = std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(this_00);
  maxTagLen = (size_t)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(this_00);
  maxNameLen = 0;
  local_38 = 0;
  while (bVar2 = __gnu_cxx::operator!=
                           (&itEnd,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                    *)&maxTagLen), bVar2) {
    pvVar4 = Config::filters(config);
    pTVar6 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar2 = matchesFilters(pvVar4,pTVar6);
    if (bVar2) {
      pTVar7 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&itEnd);
      TestCase::getTestCaseInfo(pTVar7);
      local_40 = std::__cxx11::string::size();
      puVar10 = std::max<unsigned_long>(&local_40,&maxNameLen);
      maxNameLen = *puVar10;
      pTVar7 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&itEnd);
      TestCase::getTestCaseInfo(pTVar7);
      matchedTests = std::__cxx11::string::size();
      puVar10 = std::max<unsigned_long>(&matchedTests,&local_38);
      local_38 = *puVar10;
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  while (0x4b < maxNameLen + local_38) {
    if (maxNameLen < 0x1f) {
      local_38 = local_38 - 1;
    }
    else {
      maxNameLen = maxNameLen - 1;
    }
  }
  local_50 = 0;
  nameWrapper.lines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin(this_00);
  itEnd = (const_iterator)
          nameWrapper.lines.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  while (bVar2 = __gnu_cxx::operator!=
                           (&itEnd,(__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                                    *)&maxTagLen), bVar2) {
    pvVar4 = Config::filters(config);
    pTVar6 = __gnu_cxx::
             __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
             ::operator*(&itEnd);
    bVar2 = matchesFilters(pvVar4,pTVar6);
    if (bVar2) {
      local_50 = local_50 + 1;
      pTVar7 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&itEnd);
      pTVar8 = TestCase::getTestCaseInfo(pTVar7);
      this = &tagsWrapper.lines.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      TextAttributes::TextAttributes((TextAttributes *)this);
      pTVar9 = TextAttributes::setWidth((TextAttributes *)this,local_38);
      pTVar9 = TextAttributes::setInitialIndent(pTVar9,2);
      pTVar9 = TextAttributes::setIndent(pTVar9,4);
      Text::Text((Text *)local_b0,&pTVar8->name,pTVar9);
      pTVar7 = __gnu_cxx::
               __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
               ::operator->(&itEnd);
      pTVar8 = TestCase::getTestCaseInfo(pTVar7);
      TextAttributes::TextAttributes(&local_148);
      pTVar9 = TextAttributes::setWidth(&local_148,maxNameLen);
      pTVar9 = TextAttributes::setInitialIndent(pTVar9,0);
      pTVar9 = TextAttributes::setIndent(pTVar9,2);
      Text::Text((Text *)local_128,&pTVar8->tagsAsString,pTVar9);
      local_160 = 0;
      while( true ) {
        uVar13 = local_160;
        local_168 = Text::size((Text *)local_b0);
        sStack_170 = Text::size((Text *)local_128);
        puVar10 = std::max<unsigned_long>(&local_168,&stack0xfffffffffffffe90);
        if (*puVar10 <= uVar13) break;
        local_174 = None;
        pTVar7 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator->(&itEnd);
        pTVar8 = TestCase::getTestCaseInfo(pTVar7);
        if ((pTVar8->isHidden & 1U) != 0) {
          local_174 = FileName;
        }
        std::__cxx11::string::string(local_198);
        uVar13 = local_160;
        sVar11 = Text::size((Text *)local_b0);
        if (uVar13 < sVar11) {
          psVar12 = Text::operator[][abi_cxx11_((Text *)local_b0,local_160);
          std::__cxx11::string::operator=(local_198,(string *)psVar12);
        }
        else {
          std::__cxx11::string::operator=(local_198,"    ...");
          local_174 = FileName;
        }
        Colour::Colour(&local_199,local_174);
        std::operator<<((ostream *)&std::cout,local_198);
        Colour::~Colour(&local_199);
        uVar13 = local_160;
        sVar11 = Text::size((Text *)local_128);
        if (uVar13 < sVar11) {
          Text::operator[][abi_cxx11_((Text *)local_128,local_160);
          uVar13 = std::__cxx11::string::empty();
          uVar1 = local_38;
          if ((uVar13 & 1) == 0) {
            if (local_160 == 0) {
              Colour::Colour(&local_19a,FileName);
              poVar15 = std::operator<<((ostream *)&std::cout,"  ");
              uVar1 = local_38;
              lVar14 = std::__cxx11::string::size();
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1c0,uVar1 - lVar14,'.',&local_1c1);
              poVar15 = std::operator<<(poVar15,local_1c0);
              std::operator<<(poVar15,"  ");
              std::__cxx11::string::~string(local_1c0);
              std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
              Colour::~Colour(&local_19a);
            }
            else {
              lVar14 = std::__cxx11::string::size();
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_1e8,uVar1 - lVar14,' ',&local_1e9);
              poVar15 = std::operator<<((ostream *)&std::cout,local_1e8);
              std::operator<<(poVar15,"    ");
              std::__cxx11::string::~string(local_1e8);
              std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            }
            psVar12 = Text::operator[][abi_cxx11_((Text *)local_128,local_160);
            std::operator<<((ostream *)&std::cout,(string *)psVar12);
          }
        }
        std::operator<<((ostream *)&std::cout,"\n");
        std::__cxx11::string::~string(local_198);
        local_160 = local_160 + 1;
      }
      Text::~Text((Text *)local_128);
      Text::~Text((Text *)local_b0);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&itEnd);
  }
  pvVar4 = Config::filters(config);
  bVar2 = std::vector<Catch::TestCaseFilters,_std::allocator<Catch::TestCaseFilters>_>::empty
                    (pvVar4);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"test case",&local_239);
    pluralise::pluralise(&local_218,local_50,(string *)local_238);
    poVar15 = operator<<((ostream *)&std::cout,&local_218);
    poVar15 = std::operator<<(poVar15,"\n");
    std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_218);
    std::__cxx11::string::~string(local_238);
    std::allocator<char>::~allocator((allocator<char> *)&local_239);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_288,"matching test case",&local_289);
    pluralise::pluralise(&local_268,local_50,(string *)local_288);
    poVar15 = operator<<((ostream *)&std::cout,&local_268);
    poVar15 = std::operator<<(poVar15,"\n");
    std::ostream::operator<<(poVar15,std::endl<char,std::char_traits<char>>);
    pluralise::~pluralise(&local_268);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator((allocator<char> *)&local_289);
  }
  return local_50;
}

Assistant:

inline std::size_t listTests( Config const& config ) {
        if( config.filters().empty() )
            std::cout << "All available test cases:\n";
        else
            std::cout << "Matching test cases:\n";
        std::vector<TestCase> const& allTests = getRegistryHub().getTestCaseRegistry().getAllTests();
        std::vector<TestCase>::const_iterator it = allTests.begin(), itEnd = allTests.end();

        // First pass - get max tags
        std::size_t maxTagLen = 0;
        std::size_t maxNameLen = 0;
        for(; it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                maxTagLen = (std::max)( it->getTestCaseInfo().tagsAsString.size(), maxTagLen );
                maxNameLen = (std::max)( it->getTestCaseInfo().name.size(), maxNameLen );
            }
        }

        // Try to fit everything in. If not shrink tag column first, down to 30
        // then shrink name column until it all fits (strings will be wrapped within column)
        while( maxTagLen + maxNameLen > CATCH_CONFIG_CONSOLE_WIDTH-5 ) {
            if( maxTagLen > 30 )
                --maxTagLen;
            else
                --maxNameLen;
        }

        std::size_t matchedTests = 0;
        for( it = allTests.begin(); it != itEnd; ++it ) {
            if( matchesFilters( config.filters(), *it ) ) {
                matchedTests++;
                Text nameWrapper(   it->getTestCaseInfo().name,
                                    TextAttributes()
                                        .setWidth( maxNameLen )
                                        .setInitialIndent(2)
                                        .setIndent(4) );

                Text tagsWrapper(   it->getTestCaseInfo().tagsAsString,
                                    TextAttributes()
                                        .setWidth( maxTagLen )
                                        .setInitialIndent(0)
                                        .setIndent( 2 ) );

                for( std::size_t i = 0; i < (std::max)( nameWrapper.size(), tagsWrapper.size() ); ++i ) {
                    Colour::Code colour = Colour::None;
                    if( it->getTestCaseInfo().isHidden )
                        colour = Colour::SecondaryText;
                    std::string nameCol;
                    if( i < nameWrapper.size() ) {
                        nameCol = nameWrapper[i];
                    }
                    else {
                        nameCol = "    ...";
                        colour = Colour::SecondaryText;
                    }

                    {
                        Colour colourGuard( colour );
                        std::cout << nameCol;
                    }
                    if( i < tagsWrapper.size() && !tagsWrapper[i].empty() ) {
                        if( i == 0 ) {
                            Colour colourGuard( Colour::SecondaryText );
                            std::cout << "  " << std::string( maxNameLen - nameCol.size(), '.' ) << "  ";
                        }
                        else {
                            std::cout << std::string( maxNameLen - nameCol.size(), ' ' ) << "    ";
                        }
                        std::cout << tagsWrapper[i];
                    }
                    std::cout << "\n";
                }
            }
        }
        if( config.filters().empty() )
            std::cout << pluralise( matchedTests, "test case" ) << "\n" << std::endl;
        else
            std::cout << pluralise( matchedTests, "matching test case" ) << "\n" << std::endl;
        return matchedTests;
    }